

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_create_logical_type(duckdb_type type)

{
  LogicalTypeId id;
  duckdb_type c_type;
  LogicalType *this;
  
  c_type = type;
  if ((type & ~DUCKDB_TYPE_BOOLEAN) == DUCKDB_TYPE_LIST) {
    c_type = DUCKDB_TYPE_INVALID;
  }
  if ((type & ~DUCKDB_TYPE_INTEGER) == DUCKDB_TYPE_DECIMAL) {
    c_type = DUCKDB_TYPE_INVALID;
  }
  if (type == DUCKDB_TYPE_MAP) {
    c_type = DUCKDB_TYPE_INVALID;
  }
  if (type == DUCKDB_TYPE_ARRAY) {
    c_type = DUCKDB_TYPE_INVALID;
  }
  if (type == DUCKDB_TYPE_UNION) {
    c_type = DUCKDB_TYPE_INVALID;
  }
  id = duckdb::ConvertCTypeToCPP(c_type);
  this = (LogicalType *)operator_new(0x18);
  duckdb::LogicalType::LogicalType(this,id);
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_logical_type(duckdb_type type) {
	if (type == DUCKDB_TYPE_DECIMAL || type == DUCKDB_TYPE_ENUM || type == DUCKDB_TYPE_LIST ||
	    type == DUCKDB_TYPE_STRUCT || type == DUCKDB_TYPE_MAP || type == DUCKDB_TYPE_ARRAY ||
	    type == DUCKDB_TYPE_UNION) {
		type = DUCKDB_TYPE_INVALID;
	}

	auto cpp_type = duckdb::ConvertCTypeToCPP(type);
	return reinterpret_cast<duckdb_logical_type>(new duckdb::LogicalType(cpp_type));
}